

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogram_Test::TestBody
          (TextSerializerTest_shouldSerializeHistogram_Test *this)

{
  pointer pQVar1;
  pointer pBVar2;
  pointer pcVar3;
  pointer *ppLVar4;
  undefined8 *puVar5;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  StringLike<std::__cxx11::basic_string<char>_> *substring_00;
  StringLike<std::__cxx11::basic_string<char>_> *substring_01;
  StringLike<std::__cxx11::basic_string<char>_> *substring_02;
  char *pcVar6;
  initializer_list<double> __l;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string serialized;
  Histogram histogram;
  char local_208 [8];
  undefined8 *local_200;
  AssertHelper local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  ClientMetric local_1b8;
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  char local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  char local_d8 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  Histogram local_88;
  
  local_128._0_8_ = &DAT_3ff0000000000000;
  __l._M_len = 1;
  __l._M_array = (iterator)local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1b8,__l,(allocator_type *)local_1f8);
  Histogram::Histogram(&local_88,(BucketBoundaries *)&local_1b8);
  if (local_1b8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Histogram::Observe(&local_88,0.0);
  Histogram::Observe(&local_88,200.0);
  Histogram::Collect(&local_1b8,&local_88);
  local_128._0_8_ =
       (this->super_TextSerializerTest).metric.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128._8_8_ =
       (this->super_TextSerializerTest).metric.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128._16_8_ =
       (this->super_TextSerializerTest).metric.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_TextSerializerTest).metric.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_TextSerializerTest).metric.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_TextSerializerTest).metric.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.label.
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector((vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
           *)local_128);
  (this->super_TextSerializerTest).metric.info.value = local_1b8.info.value;
  (this->super_TextSerializerTest).metric.counter.value = local_1b8.counter.value;
  (this->super_TextSerializerTest).metric.gauge.value = local_1b8.gauge.value;
  (this->super_TextSerializerTest).metric.summary.sample_count = local_1b8.summary.sample_count;
  (this->super_TextSerializerTest).metric.summary.sample_sum = local_1b8.summary.sample_sum;
  pQVar1 = (this->super_TextSerializerTest).metric.summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_TextSerializerTest).metric.summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.summary.quantile.
       super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->super_TextSerializerTest).metric.summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_1b8.summary.quantile.
       super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->super_TextSerializerTest).metric.summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_1b8.summary.quantile.
       super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pQVar1 != (pointer)0x0) {
    operator_delete(pQVar1);
  }
  (this->super_TextSerializerTest).metric.histogram.sample_count = local_1b8.histogram.sample_count;
  (this->super_TextSerializerTest).metric.histogram.sample_sum = local_1b8.histogram.sample_sum;
  pBVar2 = (this->super_TextSerializerTest).metric.histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_TextSerializerTest).metric.histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.histogram.bucket.
       super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->super_TextSerializerTest).metric.histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_1b8.histogram.bucket.
       super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->super_TextSerializerTest).metric.histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_1b8.histogram.bucket.
       super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2);
  }
  (this->super_TextSerializerTest).metric.untyped.value = local_1b8.untyped.value;
  (this->super_TextSerializerTest).metric.timestamp_ms = local_1b8.timestamp_ms;
  if (local_1b8.histogram.bucket.
      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.histogram.bucket.
                    super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1b8.summary.quantile.
      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.summary.quantile.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&local_1b8.label);
  (anonymous_namespace)::TextSerializerTest::Serialize_abi_cxx11_
            ((string *)local_128,this,Histogram);
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar3,
             pcVar3 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_1d8);
  testing::HasSubstr<std::__cxx11::string>(&local_a8,(testing *)local_1d8,substring);
  ppLVar4 = (pointer *)
            ((long)&local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
            + 0x10);
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppLVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_a8.impl_.substring_._M_dataplus._M_p,
             local_a8.impl_.substring_._M_dataplus._M_p + local_a8.impl_.substring_._M_string_length
            );
  local_1f8[0].data_ = (AssertHelperData *)local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,
             local_1b8.label.
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (long)&((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus._M_p +
             (long)local_1b8.label.
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  if (local_1b8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppLVar4) {
    operator_delete(local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_208,(char *)local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_1f8[0].data_ != (AssertHelperData *)local_1e8) {
    operator_delete(local_1f8[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.impl_.substring_._M_dataplus._M_p != &local_a8.impl_.substring_.field_2) {
    operator_delete(local_a8.impl_.substring_._M_dataplus._M_p);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  if (local_208[0] == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_200 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_200;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x68,pcVar6);
    testing::internal::AssertHelper::operator=(local_1f8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    if (local_1b8.label.
        super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*(pointer *)
                   &((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)->name).
                _M_string_length)();
    }
  }
  puVar5 = local_200;
  if (local_200 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_200 != local_200 + 2) {
      operator_delete((undefined8 *)*local_200);
    }
    operator_delete(puVar5);
  }
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar3,
             pcVar3 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_1d8);
  testing::HasSubstr<std::__cxx11::string>(&local_c8,(testing *)local_1d8,substring_00);
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppLVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_c8.impl_.substring_._M_dataplus._M_p,
             local_c8.impl_.substring_._M_dataplus._M_p + local_c8.impl_.substring_._M_string_length
            );
  local_1f8[0].data_ = (AssertHelperData *)local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,
             local_1b8.label.
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (long)&((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
             (long)&((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus._M_p);
  if (local_1b8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppLVar4) {
    operator_delete(local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_208,(char *)local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_1f8[0].data_ != (AssertHelperData *)local_1e8) {
    operator_delete(local_1f8[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.impl_.substring_._M_dataplus._M_p != &local_c8.impl_.substring_.field_2) {
    operator_delete(local_c8.impl_.substring_._M_dataplus._M_p);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  if (local_208[0] == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_200 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_200;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x69,pcVar6);
    testing::internal::AssertHelper::operator=(local_1f8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    if (local_1b8.label.
        super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*(pointer *)
                   &((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)->name).
                _M_string_length)();
    }
  }
  puVar5 = local_200;
  if (local_200 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_200 != local_200 + 2) {
      operator_delete((undefined8 *)*local_200);
    }
    operator_delete(puVar5);
  }
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar3,
             pcVar3 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_1d8);
  testing::HasSubstr<std::__cxx11::string>
            ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_e8,(testing *)local_1d8,substring_01);
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppLVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_e8._M_allocated_capacity,
             (char *)(local_e8._8_8_ + local_e8._M_allocated_capacity));
  local_1f8[0].data_ = (AssertHelperData *)local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,
             local_1b8.label.
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (long)&((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus._M_p +
             (long)local_1b8.label.
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  if (local_1b8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppLVar4) {
    operator_delete(local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_208,(char *)local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_1f8[0].data_ != (AssertHelperData *)local_1e8) {
    operator_delete(local_1f8[0].data_);
  }
  if ((char *)local_e8._M_allocated_capacity != local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  if (local_208[0] == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_200 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_200;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x6a,pcVar6);
    testing::internal::AssertHelper::operator=(local_1f8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    if (local_1b8.label.
        super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*(pointer *)
                   &((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)->name).
                _M_string_length)();
    }
  }
  puVar5 = local_200;
  if (local_200 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_200 != local_200 + 2) {
      operator_delete((undefined8 *)*local_200);
    }
    operator_delete(puVar5);
  }
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar3,
             pcVar3 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)local_1d8);
  testing::HasSubstr<std::__cxx11::string>
            ((PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108,(testing *)local_1d8,substring_02);
  local_1b8.label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppLVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_108._M_allocated_capacity,
             (char *)(local_108._8_8_ + local_108._M_allocated_capacity));
  local_1f8[0].data_ = (AssertHelperData *)local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,
             local_1b8.label.
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (long)&((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus._M_p +
             (long)local_1b8.label.
                   super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  if (local_1b8.label.
      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppLVar4) {
    operator_delete(local_1b8.label.
                    super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_208,(char *)local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  if (local_1f8[0].data_ != (AssertHelperData *)local_1e8) {
    operator_delete(local_1f8[0].data_);
  }
  if ((char *)local_108._M_allocated_capacity != local_f8) {
    operator_delete((void *)local_108._M_allocated_capacity);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  if (local_208[0] == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_200 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_200;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x6c,pcVar6);
    testing::internal::AssertHelper::operator=(local_1f8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1f8);
    if (local_1b8.label.
        super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*(pointer *)
                   &((local_1b8.label.
                      super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)->name).
                _M_string_length)();
    }
  }
  if (local_200 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_200 != local_200 + 2) {
      operator_delete((undefined8 *)*local_200);
    }
    operator_delete(local_200);
  }
  if ((pointer)local_128._0_8_ != (pointer)(local_128 + 0x10)) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_88.bucket_counts_.
      super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.bucket_counts_.
                    super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.bucket_boundaries_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.bucket_boundaries_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogram) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(200);
  metric = histogram.Collect();

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 200\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"1\"} 1\n"));
  EXPECT_THAT(serialized,
              testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2\n"));
}